

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas0.cpp
# Opt level: O0

float r4_max(float x,float y)

{
  float local_14;
  float value;
  float y_local;
  float x_local;
  
  local_14 = y;
  if (y < x) {
    local_14 = x;
  }
  return local_14;
}

Assistant:

float r4_max ( float x, float y )

//****************************************************************************80
//
//  Purpose:
//
//    R4_MAX returns the maximum of two R4's.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    14 November 2006
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, float X, Y, the quantities to compare.
//
//    Output, float R4_MAX, the maximum of X and Y.
//
{
  float value;

  if ( y < x )
  {
    value = x;
  }
  else
  {
    value = y;
  }
  return value;
}